

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder *segment;
  CapTableReader *capTable;
  word *refTarget;
  ElementSize expectedElementSize;
  bool bVar1;
  int nestingLimit;
  WirePointer *pWVar2;
  Fault local_20;
  Fault f;
  ElementSize elementSize_local;
  OrphanBuilder *this_local;
  
  f.exception._7_1_ = elementSize;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    segment = this->segment;
    capTable = &this->capTable->super_CapTableReader;
    pWVar2 = tagAsPtr(this);
    expectedElementSize = f.exception._7_1_;
    refTarget = this->location;
    nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
    WireHelpers::readListPointer
              (__return_storage_ptr__,&segment->super_SegmentReader,capTable,pWVar2,refTarget,
               (word *)0x0,expectedElementSize,nestingLimit,true);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xe12,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}